

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dictionary.h
# Opt level: O0

RecyclerWeakReference<Js::Type> * __thiscall
JsUtil::WeaklyReferencedKeyDictionary<Js::Type,_bool,_DefaultComparer<const_Js::Type_*>,_true>::
Insert(WeaklyReferencedKeyDictionary<Js::Type,_bool,_DefaultComparer<const_Js::Type_*>,_true> *this,
      RecyclerWeakReference<Js::Type> *weakRef,bool value,int hash,uint bucket)

{
  int iVar1;
  bool bVar2;
  WeakRefDictionaryEntry<Js::Type,_bool> **ppWVar3;
  int **ppiVar4;
  RecyclerWeakReference<Js::Type> **ppRVar5;
  int local_28;
  uint local_24;
  int index;
  uint bucket_local;
  int hash_local;
  bool value_local;
  RecyclerWeakReference<Js::Type> *weakRef_local;
  WeaklyReferencedKeyDictionary<Js::Type,_bool,_DefaultComparer<const_Js::Type_*>,_true> *this_local
  ;
  
  local_24 = bucket;
  if (this->freeCount < 1) {
    if (this->count == this->size) {
      bVar2 = Clean(this);
      if (bVar2) {
        local_28 = this->freeList;
        ppWVar3 = Memory::WriteBarrierPtr::operator_cast_to_WeakRefDictionaryEntry__
                            ((WriteBarrierPtr *)&this->entries);
        this->freeList = (*ppWVar3)[local_28].next;
        this->freeCount = this->freeCount + -1;
      }
      else {
        Resize(this);
        local_24 = PrimePolicy::GetBucket(hash,this->size,this->modFunctionIndex);
        local_28 = this->count;
        this->count = this->count + 1;
      }
    }
    else {
      local_28 = this->count;
      this->count = this->count + 1;
    }
  }
  else {
    local_28 = this->freeList;
    ppWVar3 = Memory::WriteBarrierPtr::operator_cast_to_WeakRefDictionaryEntry__
                        ((WriteBarrierPtr *)&this->entries);
    this->freeList = (*ppWVar3)[local_28].next;
    this->freeCount = this->freeCount + -1;
  }
  ppiVar4 = Memory::WriteBarrierPtr::operator_cast_to_int__((WriteBarrierPtr *)&this->buckets);
  iVar1 = (*ppiVar4)[local_24];
  ppWVar3 = Memory::WriteBarrierPtr::operator_cast_to_WeakRefDictionaryEntry__
                      ((WriteBarrierPtr *)&this->entries);
  (*ppWVar3)[local_28].next = iVar1;
  ppWVar3 = Memory::WriteBarrierPtr::operator_cast_to_WeakRefDictionaryEntry__
                      ((WriteBarrierPtr *)&this->entries);
  Memory::WriteBarrierPtr<const_Memory::RecyclerWeakReference<Js::Type>_>::operator=
            (&(*ppWVar3)[local_28].key,weakRef);
  ppWVar3 = Memory::WriteBarrierPtr::operator_cast_to_WeakRefDictionaryEntry__
                      ((WriteBarrierPtr *)&this->entries);
  (*ppWVar3)[local_28].hash = hash;
  ppWVar3 = Memory::WriteBarrierPtr::operator_cast_to_WeakRefDictionaryEntry__
                      ((WriteBarrierPtr *)&this->entries);
  (*ppWVar3)[local_28].value = value;
  ppiVar4 = Memory::WriteBarrierPtr::operator_cast_to_int__((WriteBarrierPtr *)&this->buckets);
  (*ppiVar4)[local_24] = local_28;
  this->version = this->version + 1;
  ppWVar3 = Memory::WriteBarrierPtr::operator_cast_to_WeakRefDictionaryEntry__
                      ((WriteBarrierPtr *)&this->entries);
  ppRVar5 = Memory::WriteBarrierPtr::operator_cast_to_RecyclerWeakReference__
                      ((WriteBarrierPtr *)&(*ppWVar3)[local_28].key);
  return *ppRVar5;
}

Assistant:

const RecyclerWeakReference<TKey>* Insert(const RecyclerWeakReference<TKey>* weakRef, TValue value, int hash, uint bucket)
        {
            int index;
            if (freeCount > 0)
            {
                index = freeList;
                freeList = entries[index].next;
                freeCount--;
            }
            else
            {
                if (count == size)
                {
                    if (cleanOnInsert && Clean())
                    {
                        index = freeList;
                        freeList = entries[index].next;
                        freeCount--;
                    }
                    else
                    {
                        Resize();
                        bucket = PrimePolicy::GetBucket(hash, size, modFunctionIndex);
                        index = count;
                        count++;
                    }
                }
                else
                {
                    index = count;
                    count++;
                }
            }

            entries[index].next = buckets[bucket];
            entries[index].key = weakRef;
            entries[index].hash = hash;
            entries[index].value = value;
            buckets[bucket] = index;
            version++;

            return entries[index].key;
        }